

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O0

int do_rsa_print(BIO *out,RSA *rsa,int off,int include_private)

{
  int iVar1;
  char *local_40;
  char *str;
  char *s;
  int mod_len;
  int include_private_local;
  int off_local;
  RSA *rsa_local;
  BIO *out_local;
  
  s._4_4_ = 0;
  if (rsa->n != (BIGNUM *)0x0) {
    s._4_4_ = BN_num_bits((BIGNUM *)rsa->n);
  }
  iVar1 = BIO_indent((BIO *)out,off,0x80);
  if (iVar1 == 0) {
    out_local._4_4_ = 0;
  }
  else {
    if ((include_private == 0) || (rsa->d == (BIGNUM *)0x0)) {
      iVar1 = BIO_printf((BIO *)out,"Public-Key: (%d bit)\n",(ulong)s._4_4_);
      if (iVar1 < 1) {
        return 0;
      }
      local_40 = "Modulus:";
      str = "Exponent:";
    }
    else {
      iVar1 = BIO_printf((BIO *)out,"Private-Key: (%d bit)\n",(ulong)s._4_4_);
      if (iVar1 < 1) {
        return 0;
      }
      local_40 = "modulus:";
      str = "publicExponent:";
    }
    iVar1 = bn_print(out,local_40,rsa->n,off);
    if ((iVar1 == 0) || (iVar1 = bn_print(out,str,rsa->e,off), iVar1 == 0)) {
      out_local._4_4_ = 0;
    }
    else if ((include_private == 0) ||
            ((((iVar1 = bn_print(out,"privateExponent:",rsa->d,off), iVar1 != 0 &&
               (iVar1 = bn_print(out,"prime1:",rsa->p,off), iVar1 != 0)) &&
              (iVar1 = bn_print(out,"prime2:",rsa->q,off), iVar1 != 0)) &&
             (((iVar1 = bn_print(out,"exponent1:",rsa->dmp1,off), iVar1 != 0 &&
               (iVar1 = bn_print(out,"exponent2:",rsa->dmq1,off), iVar1 != 0)) &&
              (iVar1 = bn_print(out,"coefficient:",rsa->iqmp,off), iVar1 != 0)))))) {
      out_local._4_4_ = 1;
    }
    else {
      out_local._4_4_ = 0;
    }
  }
  return out_local._4_4_;
}

Assistant:

static int do_rsa_print(BIO *out, const RSA *rsa, int off,
                        int include_private) {
  int mod_len = 0;
  if (rsa->n != NULL) {
    mod_len = BN_num_bits(rsa->n);
  }

  if (!BIO_indent(out, off, 128)) {
    return 0;
  }

  const char *s, *str;
  if (include_private && rsa->d) {
    if (BIO_printf(out, "Private-Key: (%d bit)\n", mod_len) <= 0) {
      return 0;
    }
    str = "modulus:";
    s = "publicExponent:";
  } else {
    if (BIO_printf(out, "Public-Key: (%d bit)\n", mod_len) <= 0) {
      return 0;
    }
    str = "Modulus:";
    s = "Exponent:";
  }
  if (!bn_print(out, str, rsa->n, off) || !bn_print(out, s, rsa->e, off)) {
    return 0;
  }

  if (include_private) {
    if (!bn_print(out, "privateExponent:", rsa->d, off) ||
        !bn_print(out, "prime1:", rsa->p, off) ||
        !bn_print(out, "prime2:", rsa->q, off) ||
        !bn_print(out, "exponent1:", rsa->dmp1, off) ||
        !bn_print(out, "exponent2:", rsa->dmq1, off) ||
        !bn_print(out, "coefficient:", rsa->iqmp, off)) {
      return 0;
    }
  }

  return 1;
}